

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::checkLayout
          (uint32_t struct_id,char *storage_class_str,char *decoration_str,bool blockRules,
          bool scalar_block_layout,uint32_t incoming_offset,MemberConstraints *constraints,
          ValidationState_t *vstate)

{
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  spv_const_validator_options psVar4;
  bool bVar5;
  pointer pMVar6;
  pointer pMVar7;
  pointer puVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  spv_result_t sVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  const_iterator cVar14;
  long lVar15;
  value_type *pvVar16;
  mapped_type *inherited;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  bool roundUp;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  const_iterator cVar25;
  char cVar26;
  _Rb_tree_color _Var27;
  int iVar28;
  _Rb_tree_color _Var29;
  _Rb_tree_color _Var30;
  _Rb_tree_node_base *p_Var31;
  pointer __n;
  bool scalar_block_layout_00;
  undefined7 in_register_00000081;
  _Rb_tree_node_base *p_Var32;
  byte bVar33;
  _Rb_tree_header *p_Var34;
  _Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *this;
  char cVar35;
  value_type *__x;
  value_type *pvVar36;
  ulong uVar37;
  bool bVar38;
  FieldDecorationsIter FVar39;
  spv_result_t local_30c;
  bool local_305;
  undefined4 local_304;
  ulong local_300;
  uint32_t struct_id_local;
  ulong local_2f0;
  uint local_2e4;
  ulong local_2e0;
  Instruction *local_2d8;
  uint local_2cc;
  uint local_2c8;
  allocator_type local_2c1;
  Instruction *local_2c0;
  vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> member_offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  anon_class_40_7_b84d8406 fail;
  vector<bool,_std::allocator<bool>_> seen;
  spv_result_t local_38;
  
  local_300 = CONCAT44(local_300._4_4_,incoming_offset);
  local_304 = (undefined4)CONCAT71(in_register_00000081,scalar_block_layout);
  psVar4 = vstate->options_;
  sVar11 = SPV_SUCCESS;
  if (psVar4->skip_block_layout == false) {
    roundUp = (bool)(~psVar4->uniform_buffer_standard_layout & blockRules);
    bVar19 = 1;
    if ((vstate->features_).env_relaxed_block_layout == false) {
      bVar19 = psVar4->relax_block_layout;
    }
    fail.vstate = vstate;
    struct_id_local = struct_id;
    fail.struct_id = struct_id;
    fail.storage_class_str = storage_class_str;
    fail.decoration_str = decoration_str;
    fail.blockRules = roundUp;
    fail.relaxed_block_layout = (bool)bVar19;
    fail.scalar_block_layout = scalar_block_layout;
    pIVar12 = ValidationState_t::FindDef(vstate,struct_id);
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pIVar12->inst_).opcode == 0x1e) {
      pIVar13 = ValidationState_t::FindDef(vstate,struct_id_local);
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._12_4_ = 0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&seen,
                 (pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 2,
                 (pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      __n = members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      puVar8 = members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_start.super__Bit_iterator_base._M_p;
      members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_start.super__Bit_iterator_base._8_8_;
      members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_finish.super__Bit_iterator_base._M_p;
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._12_4_ = 0;
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      if (puVar8 != (pointer)0x0) {
        __n = (pointer)((long)__n - (long)puVar8);
        operator_delete(puVar8,(ulong)__n);
      }
      if (seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
          super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        __n = (pointer)((long)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                       (long)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        operator_delete(seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,(ulong)__n);
      }
    }
    else {
      __n = (pointer)0x0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&members,(iterator)0x0,
                 &struct_id_local);
    }
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pIVar12->inst_).opcode == 0x1e) {
      this = (_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)
             ((long)members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2);
      if ((ulong)this >> 0x3c != 0) {
        std::__throw_length_error("vector::reserve");
      }
      __x = (value_type *)0x0;
      cVar25._M_node = (_Rb_tree_node_base *)0x0;
      if (this != (_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)0x0) {
        member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             std::_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::_M_allocate
                       (this,(size_t)__n);
        member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
             _M_impl.super__Vector_impl_data._M_finish + (long)this;
      }
      _Var30 = (_Rb_tree_color)
               ((ulong)((long)members.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl
      .super__Vector_impl_data._M_start =
           member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (_Var30 != _S_red) {
        _Var29 = _S_red;
        __x = (value_type *)&seen;
        p_Var31 = cVar25._M_node;
        do {
          FVar39 = ValidationState_t::id_member_decorations(vstate,struct_id_local,_Var29);
          cVar25 = FVar39.end._M_node;
          cVar14 = FVar39.begin._M_node;
          if (cVar14._M_node == cVar25._M_node) {
            _Var27 = ~_S_red;
            cVar25._M_node = p_Var31;
          }
          else {
            _Var27 = ~_S_red;
            do {
              if (cVar14._M_node[2]._M_color != _Var29) {
                __assert_fail("decoration->struct_member_index() == (int)memberIdx",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                              ,0x1d4,
                              "spv_result_t spvtools::val::(anonymous namespace)::checkLayout(uint32_t, const char *, const char *, bool, bool, uint32_t, MemberConstraints &, ValidationState_t &)"
                             );
              }
              if (cVar14._M_node[1]._M_color == 0x23) {
                _Var27 = (cVar14._M_node[1]._M_parent)->_M_color;
              }
              cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
            } while (cVar14._M_node != cVar25._M_node);
          }
          seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
          super__Bit_iterator_base._M_p = (_Bit_type *)CONCAT44(_Var27 + (int)local_300,_Var29);
          std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::push_back
                    (&member_offsets,__x);
          _Var29 = _Var29 + _S_black;
          p_Var31 = cVar25._M_node;
        } while (_Var29 != _Var30);
      }
      pMVar7 = member_offsets.
               super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pMVar6 = member_offsets.
               super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar15 = (long)member_offsets.
                       super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)member_offsets.
                       super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        p_Var31 = (_Rb_tree_node_base *)((lVar15 - (lVar15 + 1 >> 0x3f)) + 1 >> 1);
        if (0xffffffffffffffe < (long)p_Var31) {
          p_Var31 = (_Rb_tree_node_base *)0xfffffffffffffff;
        }
        do {
          if ((long)p_Var31 < 1) {
            pvVar36 = (value_type *)0x0;
            p_Var32 = (_Rb_tree_node_base *)0x0;
            break;
          }
          pvVar16 = (value_type *)operator_new((long)p_Var31 * 8,(nothrow_t *)&std::nothrow);
          p_Var32 = p_Var31;
          pvVar36 = pvVar16;
          if (pvVar16 == (value_type *)0x0) {
            p_Var32 = cVar25._M_node;
            pvVar36 = __x;
            if (p_Var31 == (_Rb_tree_node_base *)0x1) {
              p_Var31 = (_Rb_tree_node_base *)0x0;
            }
            else {
              p_Var31 = (_Rb_tree_node_base *)((ulong)((long)&p_Var31->_M_color + 1) >> 1);
            }
          }
          cVar25._M_node = p_Var32;
          __x = pvVar36;
        } while (pvVar16 == (value_type *)0x0);
        if (pvVar36 == (value_type *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::MemberOffsetPair*,std::vector<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutCon___pvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::__0>>
                    (pMVar6,pMVar7);
          p_Var32 = (_Rb_tree_node_base *)0x0;
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::MemberOffsetPair*,std::vector<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutCo___pvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::__0>>
                    (pMVar6,pMVar7,pvVar36,p_Var32);
        }
        operator_delete(pvVar36,(long)p_Var32 << 3);
      }
    }
    else {
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::push_back
                (&member_offsets,(value_type *)&seen);
    }
    if (member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_30c = SPV_SUCCESS;
    }
    else {
      bVar20 = (byte)local_304;
      uVar24 = 0;
      uVar37 = 0;
      do {
        local_300 = (ulong)member_offsets.
                           super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar37].member;
        local_2f0 = (ulong)member_offsets.
                           super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar37].offset;
        uVar3 = members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[local_300];
        seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p =
             (_Bit_type *)
             CONCAT44(member_offsets.
                      super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar37].member,struct_id_local);
        inherited = std::
                    unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                    ::operator[](constraints,(key_type *)&seen);
        local_2c8 = (uint)roundUp;
        if ((char)local_304 == '\0') {
          uVar9 = getBaseAlignment(uVar3,roundUp,inherited,constraints,vstate);
          local_2e0 = CONCAT44(extraout_var_00,uVar9);
        }
        else {
          uVar9 = getScalarAlignment(uVar3,vstate);
          local_2e0 = CONCAT44(extraout_var,uVar9);
        }
        local_2c0 = ValidationState_t::FindDef(vstate,uVar3);
        uVar1 = (local_2c0->inst_).opcode;
        uVar9 = getSize(uVar3,inherited,constraints,vstate);
        uVar21 = local_2f0;
        iVar28 = (int)local_2f0;
        if (iVar28 == -1) {
          checkLayout::anon_class_40_7_b84d8406::operator()
                    ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&seen,"is missing an Offset decoration",0x1f);
          local_30c = local_38;
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
          cVar26 = '\x01';
          goto LAB_002d8ce7;
        }
        uVar23 = (uint)uVar1;
        bVar33 = uVar23 == 0x17 & bVar19 & (bVar20 ^ 1);
        if (bVar33 == 1) {
          local_2cc = uVar23;
          uVar10 = getScalarAlignment((local_2c0->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2],vstate);
          if (uVar10 != 0) {
            iVar28 = (int)((uVar21 & 0xffffffff) % (ulong)uVar10);
          }
          uVar23 = local_2cc;
          if (iVar28 != 0) {
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&seen,"at offset ",10);
            std::ostream::_M_insert<unsigned_long>((ulong)&seen);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&seen," is not aligned to scalar element size ",0x27);
            std::ostream::_M_insert<unsigned_long>((ulong)&seen);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
            goto LAB_002d8cdf;
          }
LAB_002d8c5e:
          if ((uint)local_2f0 < uVar24) {
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&seen,"at offset ",10);
            std::ostream::_M_insert<unsigned_long>((ulong)&seen);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&seen," overlaps previous member ending at offset ",0x2b);
            goto LAB_002d8cc2;
          }
          if (bVar33 != 0) {
            uVar10 = getSize(uVar3,inherited,constraints,vstate);
            if (uVar10 < 0x11) {
              if (0xf < ((uVar10 + (uint)local_2f0) - 1 ^ (uint)local_2f0)) {
LAB_002d8dde:
                checkLayout::anon_class_40_7_b84d8406::operator()
                          ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&seen,"is an improperly straddling vector at offset ",0x2d);
                goto LAB_002d8cc2;
              }
            }
            else if ((local_2f0 & 0xf) != 0) goto LAB_002d8dde;
          }
          scalar_block_layout_00 = SUB41(local_304,0);
          if (uVar23 == 0x18) {
            uVar22 = inherited->matrix_stride;
            if ((int)local_2e0 != 0) {
              uVar22 = (uint)((ulong)uVar22 % (local_2e0 & 0xffffffff));
            }
            if (uVar22 != 0) {
              checkLayout::anon_class_40_7_b84d8406::operator()
                        ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&seen,"is a matrix with stride ",0x18);
              std::ostream::_M_insert<unsigned_long>((ulong)&seen);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&seen," not satisfying alignment to ",0x1d);
              std::ostream::_M_insert<unsigned_long>((ulong)&seen);
              local_30c = local_38;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
            }
            cVar26 = '\x01';
            if (uVar22 == 0) goto LAB_002d8ec7;
          }
          else if ((uVar23 == 0x1e) &&
                  (sVar11 = checkLayout(uVar3,storage_class_str,decoration_str,SUB41(local_2c8,0),
                                        scalar_block_layout_00,(uint32_t)local_2f0,constraints,
                                        vstate), sVar11 != SPV_SUCCESS)) {
            cVar26 = '\x01';
            local_30c = sVar11;
          }
          else {
LAB_002d8ec7:
            uVar21 = local_2e0 & 0xffffffff;
            local_2cc = uVar23;
            do {
              pIVar12 = local_2c0;
              if (((local_2c0->inst_).opcode & 0xfffe) != 0x1c) {
                uVar24 = uVar9 + (int)local_2f0;
                cVar26 = '\0';
                if (((char)local_304 == '\0') && ((local_2cc | 2) == 0x1e)) {
                  uVar24 = -(int)local_2e0 & ((int)local_2e0 + uVar24) - 1;
                }
                break;
              }
              local_2e4 = (uint)uVar21;
              uVar3 = (local_2c0->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[2];
              local_2d8 = ValidationState_t::FindDef(vstate,uVar3);
              seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)
                   CONCAT44(seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                            (pIVar12->inst_).result_id);
              pmVar17 = std::
                        map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                        ::operator[](&vstate->id_decorations_,(key_type_conflict *)&seen);
              p_Var18 = (pmVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var34 = &(pmVar17->_M_t)._M_impl.super__Rb_tree_header;
              cVar26 = '\x0e';
              bVar38 = (_Rb_tree_header *)p_Var18 == p_Var34;
              if (bVar38) {
                _Var30 = _S_red;
              }
              else {
                _Var30 = _S_red;
                do {
                  bVar5 = true;
                  if (p_Var18[1]._M_color == 6) {
                    _Var30 = (p_Var18[1]._M_parent)->_M_color;
                    if (_Var30 == _S_red) {
                      checkLayout::anon_class_40_7_b84d8406::operator()
                                ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&seen,"contains an array with stride 0",0x1f);
                    }
                    else {
                      if ((local_2e4 != 0) && (_Var30 % local_2e4 == 0)) goto LAB_002d9014;
                      checkLayout::anon_class_40_7_b84d8406::operator()
                                ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&seen,"contains an array with stride ",0x1e);
                      std::ostream::_M_insert<unsigned_long>((ulong)&seen);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&seen," not satisfying alignment to ",0x1d);
                      std::ostream::_M_insert<unsigned_long>((ulong)&seen);
                    }
                    local_30c = local_38;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
                    bVar5 = false;
                  }
LAB_002d9014:
                  if (!bVar5) {
                    cVar26 = '\x01';
                    break;
                  }
                  p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
                  bVar38 = (_Rb_tree_header *)p_Var18 == p_Var34;
                } while (!bVar38);
              }
              if (bVar38) {
                iVar28 = 0;
                if ((local_2c0->inst_).opcode == 0x1c) {
                  ValidationState_t::EvalInt32IfConst
                            ((tuple<bool,_bool,_unsigned_int> *)&seen,vstate,
                             (local_2c0->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[3]);
                  iVar28 = (int)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                }
                iVar28 = iVar28 + (uint)(iVar28 == 0);
                uVar2 = (local_2d8->inst_).opcode;
                if (uVar2 == 0x18) {
                  uVar23 = inherited->matrix_stride;
                  if ((int)local_2e0 != 0) {
                    uVar23 = (uint)((ulong)uVar23 % (local_2e0 & 0xffffffff));
                  }
                  if (uVar23 != 0) {
                    checkLayout::anon_class_40_7_b84d8406::operator()
                              ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen,"is a matrix with stride ",0x18);
                    std::ostream::_M_insert<unsigned_long>((ulong)&seen);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen," not satisfying alignment to ",0x1d);
                    std::ostream::_M_insert<unsigned_long>((ulong)&seen);
                    local_30c = local_38;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
                  }
                  cVar26 = '\x01';
                  bVar38 = uVar23 == 0;
LAB_002d928b:
                  if (!bVar38) goto LAB_002d9377;
                }
                else if (uVar2 == 0x1e) {
                  local_305 = false;
                  std::vector<bool,_std::allocator<bool>_>::vector(&seen,0x10,&local_305,&local_2c1)
                  ;
                  uVar21 = local_2f0 & 0xffffffff;
                  do {
                    uVar23 = (uint)uVar21;
                    if (((uint)*seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p >>
                         (uVar23 & 0xf) & 1) == 0) {
                      sVar11 = checkLayout(uVar3,storage_class_str,decoration_str,SUB41(local_2c8,0)
                                           ,scalar_block_layout_00,uVar23,constraints,vstate);
                      cVar35 = '\0';
                      if (sVar11 == SPV_SUCCESS) {
                        *seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                             *seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p |
                             1L << ((byte)uVar21 & 0xf);
                        bVar38 = true;
                      }
                      else {
                        cVar35 = '\x01';
                        bVar38 = false;
                        local_30c = sVar11;
                      }
                    }
                    else {
                      cVar35 = '\x10';
                      bVar38 = false;
                    }
                    if (!bVar38) goto LAB_002d9174;
                    uVar21 = (ulong)(uVar23 + _Var30);
                    iVar28 = iVar28 + -1;
                  } while (iVar28 != 0);
                  cVar35 = '\x10';
LAB_002d9174:
                  cVar26 = cVar35;
                  if (cVar35 == '\x10') {
                    cVar26 = '\0';
                  }
                  if (seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                      (_Bit_type *)0x0) {
                    operator_delete(seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                                    (long)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                          super__Bvector_impl_data._M_end_of_storage -
                                    (long)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                          super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                          ._M_p);
                    seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                    seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_start.super__Bit_iterator_base._8_8_ =
                         seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ &
                         0xffffffff00000000;
                    seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                    seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_finish.super__Bit_iterator_base._M_offset = 0;
                    seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_end_of_storage = (_Bit_pointer)0x0;
                  }
                  bVar38 = cVar35 == '\x10';
                  goto LAB_002d928b;
                }
                uVar3 = (local_2d8->inst_).result_id;
                if ((char)local_304 == '\0') {
                  local_2e4 = getBaseAlignment(uVar3,SUB41(local_2c8,0),inherited,constraints,vstate
                                              );
                }
                else {
                  local_2e4 = getScalarAlignment(uVar3,vstate);
                }
                _Var29 = getSize((local_2d8->inst_).result_id,inherited,constraints,vstate);
                if (_Var30 < _Var29) {
                  checkLayout::anon_class_40_7_b84d8406::operator()
                            ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&seen,"contains an array with stride ",0x1e);
                  std::ostream::_M_insert<unsigned_long>((ulong)&seen);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&seen,", but with an element size of ",0x1e);
                  std::ostream::_M_insert<unsigned_long>((ulong)&seen);
                  local_30c = local_38;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
                }
                cVar26 = _Var30 < _Var29;
                local_2c0 = local_2d8;
              }
LAB_002d9377:
              uVar21 = (ulong)local_2e4;
            } while (cVar26 == '\0');
          }
        }
        else {
          if ((int)local_2e0 != 0) {
            iVar28 = (int)((local_2f0 & 0xffffffff) % (local_2e0 & 0xffffffff));
          }
          if (iVar28 == 0) goto LAB_002d8c5e;
          checkLayout::anon_class_40_7_b84d8406::operator()
                    ((DiagnosticStream *)&seen,&fail,(uint32_t)local_300);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&seen,"at offset ",10);
          std::ostream::_M_insert<unsigned_long>((ulong)&seen);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&seen," is not aligned to ",0x13);
LAB_002d8cc2:
          std::ostream::_M_insert<unsigned_long>((ulong)&seen);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
LAB_002d8cdf:
          local_30c = local_38;
          cVar26 = '\x01';
        }
LAB_002d8ce7:
        if (cVar26 != '\0') goto LAB_002d93d3;
        uVar37 = uVar37 + 1;
      } while (uVar37 < (ulong)((long)member_offsets.
                                      super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)member_offsets.
                                      super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
      cVar26 = '\t';
LAB_002d93d3:
      if (cVar26 == '\t') {
        local_30c = SPV_SUCCESS;
      }
    }
    if (member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(member_offsets.
                      super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)member_offsets.
                            super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)member_offsets.
                            super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    sVar11 = local_30c;
    if (members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return sVar11;
}

Assistant:

spv_result_t checkLayout(uint32_t struct_id, const char* storage_class_str,
                         const char* decoration_str, bool blockRules,
                         bool scalar_block_layout,
                         uint32_t incoming_offset,
                         MemberConstraints& constraints,
                         ValidationState_t& vstate) {
  if (vstate.options()->skip_block_layout) return SPV_SUCCESS;

  // blockRules are the same as bufferBlock rules if the uniform buffer
  // standard layout extension is being used.
  if (vstate.options()->uniform_buffer_standard_layout) blockRules = false;

  // Relaxed layout and scalar layout can both be in effect at the same time.
  // For example, relaxed layout is implied by Vulkan 1.1.  But scalar layout
  // is more permissive than relaxed layout.
  const bool relaxed_block_layout = vstate.IsRelaxedBlockLayout();

  auto fail = [&vstate, struct_id, storage_class_str, decoration_str,
               blockRules, relaxed_block_layout,
               scalar_block_layout](uint32_t member_idx) -> DiagnosticStream {
    DiagnosticStream ds =
        std::move(vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(struct_id))
                  << "Structure id " << struct_id << " decorated as "
                  << decoration_str << " for variable in " << storage_class_str
                  << " storage class must follow "
                  << (scalar_block_layout
                          ? "scalar "
                          : (relaxed_block_layout ? "relaxed " : "standard "))
                  << (blockRules ? "uniform buffer" : "storage buffer")
                  << " layout rules: member " << member_idx << " ");
    return ds;
  };

  // If we are checking the layout of untyped pointers or physical storage
  // buffer pointers, we may not actually have a struct here. Instead, pretend
  // we have a struct with a single member at offset 0.
  const auto& struct_type = vstate.FindDef(struct_id);
  std::vector<uint32_t> members;
  if (struct_type->opcode() == spv::Op::OpTypeStruct) {
    members = getStructMembers(struct_id, vstate);
  } else {
    members.push_back(struct_id);
  }

  // To check for member overlaps, we want to traverse the members in
  // offset order.
  struct MemberOffsetPair {
    uint32_t member;
    uint32_t offset;
  };
  std::vector<MemberOffsetPair> member_offsets;

  // With untyped pointers or physical storage buffers, we might be checking
  // layouts that do not originate from a structure.
  if (struct_type->opcode() == spv::Op::OpTypeStruct) {
    member_offsets.reserve(members.size());
    for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
         memberIdx < numMembers; memberIdx++) {
      uint32_t offset = 0xffffffff;
      auto member_decorations =
          vstate.id_member_decorations(struct_id, memberIdx);
      for (auto decoration = member_decorations.begin;
           decoration != member_decorations.end; ++decoration) {
        assert(decoration->struct_member_index() == (int)memberIdx);
        switch (decoration->dec_type()) {
          case spv::Decoration::Offset:
            offset = decoration->params()[0];
            break;
          default:
            break;
        }
      }
      member_offsets.push_back(
          MemberOffsetPair{memberIdx, incoming_offset + offset});
    }
    std::stable_sort(
        member_offsets.begin(), member_offsets.end(),
        [](const MemberOffsetPair& lhs, const MemberOffsetPair& rhs) {
          return lhs.offset < rhs.offset;
        });
  } else {
    member_offsets.push_back({0, 0});
  }

  // Now scan from lowest offset to highest offset.
  uint32_t nextValidOffset = 0;
  for (size_t ordered_member_idx = 0;
       ordered_member_idx < member_offsets.size(); ordered_member_idx++) {
    const auto& member_offset = member_offsets[ordered_member_idx];
    const auto memberIdx = member_offset.member;
    const auto offset = member_offset.offset;
    auto id = members[member_offset.member];
    const LayoutConstraints& constraint =
        constraints[std::make_pair(struct_id, uint32_t(memberIdx))];
    // Scalar layout takes precedence because it's more permissive, and implying
    // an alignment that divides evenly into the alignment that would otherwise
    // be used.
    const auto alignment =
        scalar_block_layout
            ? getScalarAlignment(id, vstate)
            : getBaseAlignment(id, blockRules, constraint, constraints, vstate);
    const auto inst = vstate.FindDef(id);
    const auto opcode = inst->opcode();
    const auto size = getSize(id, constraint, constraints, vstate);
    // Check offset.
    if (offset == 0xffffffff)
      return fail(memberIdx) << "is missing an Offset decoration";
    if (!scalar_block_layout && relaxed_block_layout &&
        opcode == spv::Op::OpTypeVector) {
      // In relaxed block layout, the vector offset must be aligned to the
      // vector's scalar element type.
      const auto componentId = inst->words()[2];
      const auto scalar_alignment = getScalarAlignment(componentId, vstate);
      if (!IsAlignedTo(offset, scalar_alignment)) {
        return fail(memberIdx)
               << "at offset " << offset
               << " is not aligned to scalar element size " << scalar_alignment;
      }
    } else {
      // Without relaxed block layout, the offset must be divisible by the
      // alignment requirement.
      if (!IsAlignedTo(offset, alignment)) {
        return fail(memberIdx)
               << "at offset " << offset << " is not aligned to " << alignment;
      }
    }
    if (offset < nextValidOffset)
      return fail(memberIdx) << "at offset " << offset
                             << " overlaps previous member ending at offset "
                             << nextValidOffset - 1;
    if (!scalar_block_layout && relaxed_block_layout) {
      // Check improper straddle of vectors.
      if (spv::Op::OpTypeVector == opcode &&
          hasImproperStraddle(id, offset, constraint, constraints, vstate))
        return fail(memberIdx)
               << "is an improperly straddling vector at offset " << offset;
    }
    // Check struct members recursively.
    spv_result_t recursive_status = SPV_SUCCESS;
    if (spv::Op::OpTypeStruct == opcode &&
        SPV_SUCCESS != (recursive_status = checkLayout(
                            id, storage_class_str, decoration_str, blockRules,
                            scalar_block_layout, offset, constraints, vstate)))
      return recursive_status;
    // Check matrix stride.
    if (spv::Op::OpTypeMatrix == opcode) {
      const auto stride = constraint.matrix_stride;
      if (!IsAlignedTo(stride, alignment)) {
        return fail(memberIdx) << "is a matrix with stride " << stride
                               << " not satisfying alignment to " << alignment;
      }
    }

    // Check arrays and runtime arrays recursively.
    auto array_inst = inst;
    auto array_alignment = alignment;
    while (array_inst->opcode() == spv::Op::OpTypeArray ||
           array_inst->opcode() == spv::Op::OpTypeRuntimeArray) {
      const auto typeId = array_inst->word(2);
      const auto element_inst = vstate.FindDef(typeId);
      // Check array stride.
      uint32_t array_stride = 0;
      for (auto& decoration : vstate.id_decorations(array_inst->id())) {
        if (spv::Decoration::ArrayStride == decoration.dec_type()) {
          array_stride = decoration.params()[0];
          if (array_stride == 0) {
            return fail(memberIdx) << "contains an array with stride 0";
          }
          if (!IsAlignedTo(array_stride, array_alignment))
            return fail(memberIdx)
                   << "contains an array with stride " << decoration.params()[0]
                   << " not satisfying alignment to " << alignment;
        }
      }

      bool is_int32 = false;
      bool is_const = false;
      uint32_t num_elements = 0;
      if (array_inst->opcode() == spv::Op::OpTypeArray) {
        std::tie(is_int32, is_const, num_elements) =
            vstate.EvalInt32IfConst(array_inst->word(3));
      }
      num_elements = std::max(1u, num_elements);
      // Check each element recursively if it is a struct. There is a
      // limitation to this check if the array size is a spec constant or is a
      // runtime array then we will only check a single element. This means
      // some improper straddles might be missed.
      if (spv::Op::OpTypeStruct == element_inst->opcode()) {
        std::vector<bool> seen(16, false);
        for (uint32_t i = 0; i < num_elements; ++i) {
          uint32_t next_offset = i * array_stride + offset;
          // Stop checking if offsets repeat in terms of 16-byte multiples.
          if (seen[next_offset % 16]) {
            break;
          }

          if (SPV_SUCCESS !=
              (recursive_status = checkLayout(
                   typeId, storage_class_str, decoration_str, blockRules,
                   scalar_block_layout, next_offset, constraints, vstate)))
            return recursive_status;

          seen[next_offset % 16] = true;
        }
      } else if (spv::Op::OpTypeMatrix == element_inst->opcode()) {
        // Matrix stride would be on the array element in the struct.
        const auto stride = constraint.matrix_stride;
        if (!IsAlignedTo(stride, alignment)) {
          return fail(memberIdx)
                 << "is a matrix with stride " << stride
                 << " not satisfying alignment to " << alignment;
        }
      }

      // Proceed to the element in case it is an array.
      array_inst = element_inst;
      array_alignment = scalar_block_layout
                            ? getScalarAlignment(array_inst->id(), vstate)
                            : getBaseAlignment(array_inst->id(), blockRules,
                                               constraint, constraints, vstate);

      const auto element_size =
          getSize(element_inst->id(), constraint, constraints, vstate);
      if (element_size > array_stride) {
        return fail(memberIdx)
               << "contains an array with stride " << array_stride
               << ", but with an element size of " << element_size;
      }
    }
    nextValidOffset = offset + size;
    if (!scalar_block_layout &&
        (spv::Op::OpTypeArray == opcode || spv::Op::OpTypeStruct == opcode)) {
      // Non-scalar block layout rules don't permit anything in the padding of
      // a struct or array.
      nextValidOffset = align(nextValidOffset, alignment);
    }
  }
  return SPV_SUCCESS;
}